

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZPardisoSolver.cpp
# Opt level: O3

void __thiscall TPZPardisoSolver<float>::TPZPardisoSolver(TPZPardisoSolver<float> *this)

{
  TPZReference *pTVar1;
  TPZManVector<long_long,_64> *rval;
  
  TPZMatrixSolver<float>::TPZMatrixSolver(&this->super_TPZMatrixSolver<float>,&PTR_PTR_0181fe50);
  (this->super_TPZMatrixSolver<float>).super_TPZSolver.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZPardisoSolver_0181fdc0;
  this->fSystemType = ENonInitialized;
  this->fStructure = ENonInitialized;
  this->fProperty = ENonInitialized;
  pTVar1 = (TPZReference *)operator_new(0x10);
  (pTVar1->fCounter).super___atomic_base<int>._M_i = 0;
  pTVar1->fPointer = (TPZManVector<long_long,_64> *)0x0;
  LOCK();
  (pTVar1->fCounter).super___atomic_base<int>._M_i = 1;
  UNLOCK();
  (this->fPardisoControl).fRef = pTVar1;
  this->fHandle = (longlong *)0x0;
  (this->fParam).super_TPZVec<long_long>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01820aa8;
  (this->fParam).super_TPZVec<long_long>.fStore = (this->fParam).fExtAlloc;
  (this->fParam).super_TPZVec<long_long>.fNElements = 0x40;
  memset(&(this->fParam).super_TPZVec<long_long>.fNAlloc,0,0x208);
  this->fMax_num_factors = 1;
  this->fMatrix_num = 1;
  this->fMessageLevel = 0;
  this->fError = 0;
  (this->fPermutation)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01820b10;
  (this->fPermutation).fStore = (longlong *)0x0;
  (this->fPermutation).fNElements = 0;
  (this->fPermutation).fNAlloc = 0;
  this->fMatrixType = 0;
  this->fDecomposed = false;
  this->fPardisoInitialized = false;
  rval = (TPZManVector<long_long,_64> *)operator_new(0x220);
  (rval->super_TPZVec<long_long>)._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01820aa8;
  (rval->super_TPZVec<long_long>).fStore = rval->fExtAlloc;
  (rval->super_TPZVec<long_long>).fNElements = 0x40;
  memset(&(rval->super_TPZVec<long_long>).fNAlloc,0,0x208);
  TPZAutoPointer<TPZManVector<long_long,_64>_>::operator=(&this->fPardisoControl,rval);
  this->fHandle = (((this->fPardisoControl).fRef)->fPointer->super_TPZVec<long_long>).fStore;
  return;
}

Assistant:

TPZPardisoSolver<TVar>::TPZPardisoSolver() :
    TPZMatrixSolver<TVar>(),fPardisoControl(),fParam(64,0)
{
    fPardisoControl = new TPZManVector<long long,64>(64,0);
    fHandle = &fPardisoControl.operator->()->operator[](0);
}